

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfRle.cpp
# Opt level: O3

int Imf_3_4::rleUncompress(int inLength,int maxLength,char *in,char *out)

{
  int iVar1;
  
  iVar1 = exr_rle_uncompress_buffer((long)inLength,(long)maxLength);
  return iVar1;
}

Assistant:

int
rleUncompress (int inLength, int maxLength, const signed char in[], char out[])
{
    return static_cast<int> (
        exr_rle_uncompress_buffer (
            (size_t) inLength,
            (size_t) maxLength,
            in,
            out));
}